

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

FixupPoint * __thiscall
Allocator::construct<InstructionRegVmFinalizeContext::FixupPoint>(Allocator *this,int count)

{
  int iVar1;
  undefined4 extraout_var;
  FixupPoint *pFVar3;
  FixupPoint *pFVar2;
  
  iVar1 = (*this->_vptr_Allocator[2])(this,(ulong)(count << 4 | 4));
  pFVar2 = (FixupPoint *)CONCAT44(extraout_var,iVar1);
  if (count != 0) {
    pFVar3 = pFVar2;
    do {
      pFVar3->cmdIndex = 0;
      pFVar3->target = (VmBlock *)0x0;
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != pFVar2 + count);
  }
  return pFVar2;
}

Assistant:

T* construct(int count)
	{
		void *tmp = (void*)alloc(4 + count * sizeof(T));
		new(tmp) T[count];
		return (T*)tmp;
	}